

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::DefaultConfigRuleSyntax::setChild
          (DefaultConfigRuleSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  ConfigLiblistSyntax *pCVar7;
  logic_error *this_00;
  long *plVar8;
  size_type *psVar9;
  long *plVar10;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 2) {
    pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar5->field_0x2;
    NVar3.raw = (pvVar5->numFlags).raw;
    uVar4 = pvVar5->rawLen;
    pIVar1 = pvVar5->info;
    (this->semi).kind = pvVar5->kind;
    (this->semi).field_0x2 = uVar2;
    (this->semi).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->semi).rawLen = uVar4;
    (this->semi).info = pIVar1;
  }
  else if (index == 1) {
    ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar6 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pCVar7 = (ConfigLiblistSyntax *)0x0;
    }
    else {
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pCVar7 = (ConfigLiblistSyntax *)*ppSVar6;
      if ((pCVar7->super_ConfigRuleClauseSyntax).super_SyntaxNode.kind != ConfigLiblist) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,
                   "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::ConfigLiblistSyntax]");
      }
    }
    if (pCVar7 == (ConfigLiblistSyntax *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,
                 "slang::not_null<slang::syntax::ConfigLiblistSyntax *>::not_null(U &&) [T = slang::syntax::ConfigLiblistSyntax *, U = slang::syntax::ConfigLiblistSyntax *]"
                );
    }
    (this->liblist).ptr = pCVar7;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
                 ,"");
      plVar8 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
      psVar9 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar9) {
        local_d0.field_2._M_allocated_capacity = *psVar9;
        local_d0.field_2._8_8_ = plVar8[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar9;
      }
      local_d0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::to_string(&local_70,0xf17);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar8;
      plVar10 = plVar8 + 2;
      if (local_b0 == plVar10) {
        local_a0 = *plVar10;
        lStack_98 = plVar8[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar10;
      }
      local_a8 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar8;
      plVar10 = plVar8 + 2;
      if (local_f0 == plVar10) {
        local_e0 = *plVar10;
        lStack_d8 = plVar8[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar10;
      }
      local_e8 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar5->field_0x2;
    NVar3.raw = (pvVar5->numFlags).raw;
    uVar4 = pvVar5->rawLen;
    pIVar1 = pvVar5->info;
    (this->defaultKeyword).kind = pvVar5->kind;
    (this->defaultKeyword).field_0x2 = uVar2;
    (this->defaultKeyword).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->defaultKeyword).rawLen = uVar4;
    (this->defaultKeyword).info = pIVar1;
  }
  return;
}

Assistant:

void DefaultConfigRuleSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: defaultKeyword = child.token(); return;
        case 1: liblist = child.node() ? &child.node()->as<ConfigLiblistSyntax>() : nullptr; return;
        case 2: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}